

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

QMenuBar * __thiscall QMdiSubWindowPrivate::menuBar(QMdiSubWindowPrivate *this)

{
  bool bVar1;
  QMdiSubWindowPrivate *this_00;
  QMainWindow *pQVar2;
  QMdiSubWindowPrivate *in_RDI;
  QMainWindow *mainWindow;
  QMdiSubWindow *q;
  QMdiSubWindowPrivate *this_01;
  QMenuBar *local_8;
  
  this_01 = in_RDI;
  this_00 = (QMdiSubWindowPrivate *)q_func(in_RDI);
  bVar1 = QWidget::isMaximized((QWidget *)this_00);
  if (((!bVar1) || (bVar1 = drawTitleBarWhenMaximized(this_00), bVar1)) ||
     (bVar1 = isChildOfTabbedQMdiArea((QMdiSubWindow *)in_RDI), bVar1)) {
    local_8 = (QMenuBar *)0x0;
  }
  else {
    QWidget::window((QWidget *)this_01);
    pQVar2 = qobject_cast<QMainWindow*>((QObject *)0x62c3ba);
    if (pQVar2 == (QMainWindow *)0x0) {
      local_8 = (QMenuBar *)0x0;
    }
    else {
      local_8 = QMainWindow::menuBar((QMainWindow *)this_01);
    }
  }
  return local_8;
}

Assistant:

QMenuBar *QMdiSubWindowPrivate::menuBar() const
{
#if !QT_CONFIG(mainwindow)
    return nullptr;
#else
    Q_Q(const QMdiSubWindow);
    if (!q->isMaximized() || drawTitleBarWhenMaximized() || isChildOfTabbedQMdiArea(q))
        return nullptr;

    if (QMainWindow *mainWindow = qobject_cast<QMainWindow *>(q->window()))
        return mainWindow->menuBar();

    return nullptr;
#endif
}